

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesLongMessageForm.cxx
# Opt level: O0

void __thiscall cmCursesLongMessageForm::DrawMessage(cmCursesLongMessageForm *this,char *msg)

{
  int local_1c;
  int i;
  char *msg_local;
  cmCursesLongMessageForm *this_local;
  
  for (local_1c = 0; msg[local_1c] != '\0' && local_1c < 60000; local_1c = local_1c + 1) {
    if ((msg[local_1c] == '\n') && (msg[local_1c + 1] != '\0')) {
      form_driver((this->super_cmCursesForm).Form,0x212);
      form_driver((this->super_cmCursesForm).Form,0x218);
    }
    else {
      form_driver((this->super_cmCursesForm).Form,(int)msg[local_1c]);
    }
  }
  if (this->Scrolling == ScrollDown) {
    form_driver((this->super_cmCursesForm).Form,0x217);
  }
  else {
    form_driver((this->super_cmCursesForm).Form,0x216);
  }
  return;
}

Assistant:

void cmCursesLongMessageForm::DrawMessage(const char* msg) const
{
  int i = 0;
  while (msg[i] != '\0' && i < MAX_CONTENT_SIZE) {
    if (msg[i] == '\n' && msg[i + 1] != '\0') {
      form_driver(this->Form, REQ_NEXT_LINE);
      form_driver(this->Form, REQ_BEG_LINE);
    } else {
      form_driver(this->Form, msg[i]);
    }
    i++;
  }
  if (this->Scrolling == ScrollBehavior::ScrollDown) {
    form_driver(this->Form, REQ_END_FIELD);
  } else {
    form_driver(this->Form, REQ_BEG_FIELD);
  }
}